

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O0

size_t __thiscall
webfront::fs::File::readFStream(File *this,span<char,_18446744073709551615UL> buffer)

{
  pointer pcVar1;
  ulong uVar2;
  size_t sVar3;
  long in_RDI;
  span<char,_18446744073709551615UL> local_10;
  
  pcVar1 = http::std::span<char,_18446744073709551615UL>::data(&local_10);
  http::std::span<char,_18446744073709551615UL>::size
            ((span<char,_18446744073709551615UL> *)0x12f24f);
  std::istream::read((char *)(in_RDI + 0x50),(long)pcVar1);
  uVar2 = std::ios::eof();
  if ((uVar2 & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x28) = 1;
    std::ifstream::close();
  }
  sVar3 = std::istream::gcount();
  return sVar3;
}

Assistant:

size_t readFStream(std::span<char> buffer) {
        fstream.read(buffer.data(), static_cast<std::streamsize>(buffer.size()));
        if (fstream.eof()) {
            eofBit = true;
            fstream.close();
        }
        return static_cast<size_t>(fstream.gcount());
    }